

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O0

void __thiscall
Args::Arg::checkCorrectnessBeforeParsing(Arg *this,StringList *flags,StringList *names)

{
  bool bVar1;
  ulong uVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it_1;
  String name;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  String flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  allocator *paVar4;
  String *in_stack_fffffffffffffcd8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffce0;
  BaseException *this_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffce8;
  String *in_stack_fffffffffffffd08;
  allocator local_2b9;
  string local_2b8 [38];
  undefined1 local_292;
  undefined1 local_291 [103];
  undefined1 local_22a;
  allocator local_229;
  string local_228 [96];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  allocator local_1a1;
  string local_1a0 [32];
  string local_180 [38];
  undefined1 local_15a;
  allocator local_159;
  string local_158 [102];
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [96];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  allocator local_59;
  string local_58 [32];
  string local_38 [56];
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = details::isCorrectFlag(in_stack_fffffffffffffce8._M_current);
    if (!bVar1) {
      local_15a = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,"Disallowed flag \"-",&local_159);
      std::operator+(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      std::operator+(in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
      BaseException::BaseException
                ((BaseException *)in_stack_fffffffffffffce0._M_current,in_stack_fffffffffffffcd8);
      local_15a = 0;
      __cxa_throw(uVar3,&BaseException::typeinfo,BaseException::~BaseException);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"-",&local_59);
    std::operator+(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(in_stack_fffffffffffffcc8);
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(in_stack_fffffffffffffcc8);
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                         (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                          in_stack_fffffffffffffcd8);
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(in_stack_fffffffffffffcc8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffcd0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffcc8);
    if (bVar1) {
      local_f2 = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"Redefinition of argument with flag \"",&local_f1);
      std::operator+(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      std::operator+(in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
      BaseException::BaseException
                ((BaseException *)in_stack_fffffffffffffce0._M_current,in_stack_fffffffffffffcd8);
      local_f2 = 0;
      __cxa_throw(uVar3,&BaseException::typeinfo,BaseException::~BaseException);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffce0._M_current,in_stack_fffffffffffffcd8);
    std::__cxx11::string::~string(local_38);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = details::isCorrectName(in_stack_fffffffffffffd08);
    if (!bVar1) {
      local_292 = 1;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x30);
      this_00 = (BaseException *)local_291;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_291 + 1),"Disallowed name \"--",(allocator *)this_00);
      std::operator+(__lhs,in_stack_fffffffffffffcd0);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffcd0);
      BaseException::BaseException(this_00,__lhs);
      local_292 = 0;
      __cxa_throw(__lhs,&BaseException::typeinfo,BaseException::~BaseException);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"--",&local_1a1);
    std::operator+(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(in_stack_fffffffffffffcc8);
    local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(in_stack_fffffffffffffcc8);
    local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                          (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                           in_stack_fffffffffffffcd8);
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(in_stack_fffffffffffffcc8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffcd0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffcc8);
    if (bVar1) {
      local_22a = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,"Redefinition of argument with name \"",&local_229);
      std::operator+(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      std::operator+(in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
      BaseException::BaseException
                ((BaseException *)in_stack_fffffffffffffce0._M_current,in_stack_fffffffffffffcd8);
      local_22a = 0;
      __cxa_throw(uVar3,&BaseException::typeinfo,BaseException::~BaseException);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffce0._M_current,in_stack_fffffffffffffcd8);
    std::__cxx11::string::~string(local_180);
  }
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
    uVar3 = __cxa_allocate_exception(0x30);
    paVar4 = &local_2b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2b8,"Arguments with empty flag and name are disallowed.",paVar4);
    BaseException::BaseException
              ((BaseException *)in_stack_fffffffffffffce0._M_current,in_stack_fffffffffffffcd8);
    __cxa_throw(uVar3,&BaseException::typeinfo,BaseException::~BaseException);
  }
  return;
}

Assistant:

inline void
Arg::checkCorrectnessBeforeParsing( StringList & flags,
	StringList & names ) const
{
	if( !m_flag.empty() )
	{
		if( details::isCorrectFlag( m_flag ) )
		{
			const String flag = String( SL( "-" ) ) + m_flag;

			auto it = std::find( flags.begin(), flags.end(), flag );

			if( it != flags.end() )
				throw BaseException( String( SL( "Redefinition of argument "
					"with flag \"" ) ) + flag + SL( "\"." ) );
			else
				flags.push_back( flag );
		}
		else
			throw BaseException( String( SL( "Disallowed flag \"-" ) ) +
				m_flag + SL( "\"." ) );
	}

	if( !m_name.empty() )
	{
		if( details::isCorrectName( m_name ) )
		{
			const String name = String( SL( "--" ) ) + m_name;

			auto it = std::find( names.begin(), names.end(), name );

			if( it != names.end() )
				throw BaseException( String( SL( "Redefinition of argument "
					"with name \"" ) ) + name + SL( "\"." ) );
			else
				names.push_back( name );
		}
		else
			throw BaseException( String( SL( "Disallowed name \"--" ) ) +
				m_name + SL( "\"." ) );
	}

	if( m_flag.empty() && m_name.empty() )
		throw BaseException( String( SL( "Arguments with empty flag and name "
			"are disallowed." ) ) );
}